

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.cpp
# Opt level: O0

void * NMEADeviceThread(void *pParam)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  tm *ptVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_1230;
  interval local_1228;
  double local_1210;
  interval local_1208;
  interval local_11f0;
  double local_11d8;
  double local_11d0;
  interval local_11c8;
  double local_11b0;
  interval local_11a8;
  interval local_1190;
  double local_1178;
  double local_1170;
  interval local_1168;
  double local_1150;
  double local_1148;
  interval local_1140;
  double local_1128;
  double local_1120;
  interval local_1118;
  double local_1100;
  double z_gps_mes;
  double y_gps_mes;
  double x_gps_mes;
  char szTemp [256];
  char szSaveFilePath [256];
  int local_edc;
  char local_ed8 [4];
  int i;
  char szCfgFilePath [256];
  int local_dc8;
  int deviceid;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  BOOL bConnected;
  tm *timeptr;
  timeval tv;
  time_t tt;
  tm t;
  NMEADATA nmeadata;
  NMEADEVICE nmeadevice;
  void *pParam_local;
  
  tv.tv_usec = 0;
  chrono_period._68_4_ = 0;
  deviceid = 100;
  local_dc8 = 0;
  iVar1 = (int)pParam;
  nmeadevice._2344_8_ = pParam;
  sprintf(local_ed8,"NMEADevice%d.txt",(ulong)pParam & 0xffffffff);
  memset(&nmeadata.AIS_COG,0,0x930);
  GNSSqualityNMEADevice[iVar1] = 0;
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)deviceid);
      if (bPauseNMEADevice[iVar1] == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("NMEADevice paused.\n");
        GNSSqualityNMEADevice[iVar1] = 0;
        chrono_period._68_4_ = 0;
        DisconnectNMEADevice((NMEADEVICE *)&nmeadata.AIS_COG);
      }
      if (bExit != 0) goto LAB_0016798d;
      mSleep(100);
    }
    if (bRestartNMEADevice[iVar1] != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a NMEADevice.\n");
        GNSSqualityNMEADevice[iVar1] = 0;
        chrono_period._68_4_ = 0;
        DisconnectNMEADevice((NMEADEVICE *)&nmeadata.AIS_COG);
      }
      bRestartNMEADevice[iVar1] = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar2 = ConnectNMEADevice((NMEADEVICE *)&nmeadata.AIS_COG,local_ed8);
      if (iVar2 == 0) {
        chrono_period._68_4_ = 1;
        deviceid = nmeadevice.BaudRate;
        memset(&t.tm_zone,0,0x3d8);
        if (nmeadevice.RS232Port._784_8_ != 0) {
          fclose((FILE *)nmeadevice.RS232Port._784_8_);
          nmeadevice.RS232Port.DevType = 0;
          nmeadevice.RS232Port._788_4_ = 0;
        }
        if ((nmeadevice.timeout != 0) && (nmeadevice.RS232Port._784_8_ == 0)) {
          sVar3 = strlen((char *)&nmeadevice.LastNMEAData.AIS_COG);
          if (sVar3 == 0) {
            sprintf((char *)&x_gps_mes,"nmeadevice");
          }
          else {
            sprintf((char *)&x_gps_mes,"%.127s",&nmeadevice.LastNMEAData.AIS_COG);
          }
          sVar3 = strlen((char *)&x_gps_mes);
          local_edc = (int)sVar3;
          do {
            local_edc = local_edc + -1;
            if (local_edc < 0) break;
          } while (szTemp[(long)local_edc + -8] != '.');
          if ((0 < local_edc) && (sVar3 = strlen((char *)&x_gps_mes), local_edc < (int)sVar3)) {
            sVar3 = strlen((char *)&x_gps_mes);
            memset(szTemp + (long)local_edc + -8,0,sVar3 - (long)local_edc);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar4 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",&x_gps_mes,pcVar4);
          LeaveCriticalSection(&strtimeCS);
          nmeadevice.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)nmeadevice.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create NMEADevice data file.\n");
            goto LAB_0016798d;
          }
        }
      }
      else {
        GNSSqualityNMEADevice[iVar1] = 0;
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar2 = GetLatestDataNMEADevice((NMEADEVICE *)&nmeadata.AIS_COG,(NMEADATA *)&t.tm_zone);
      if (iVar2 == 0) {
        EnterCriticalSection(&StateVariablesCS);
        if (((int)nmeadata._116_4_ < 1) && (nmeadata.height_geoid._0_1_ != 'A')) {
          GNSSqualityNMEADevice[iVar1] = 0;
        }
        else {
          GNSSqualityNMEADevice[iVar1] = 1;
          y_gps_mes = 0.0;
          z_gps_mes = 0.0;
          local_1100 = 0.0;
          GPS2EnvCoordSystem(lat_env,long_env,alt_env,angle_env,nmeadata.timesincelastgood,
                             nmeadata.Latitude,nmeadata.Longitude,&y_gps_mes,&z_gps_mes,&local_1100)
          ;
          local_1120 = y_gps_mes - GPS_med_acc;
          local_1128 = y_gps_mes + GPS_med_acc;
          interval::interval(&local_1118,&local_1120,&local_1128);
          interval::operator=((interval *)&x_gps,&local_1118);
          local_1148 = z_gps_mes - GPS_med_acc;
          local_1150 = z_gps_mes + GPS_med_acc;
          interval::interval(&local_1140,&local_1148,&local_1150);
          interval::operator=((interval *)&y_gps,&local_1140);
          local_1170 = GPS_med_acc * -5.0 + local_1100;
          local_1178 = GPS_med_acc * 5.0 + local_1100;
          interval::interval(&local_1168,&local_1170,&local_1178);
          interval::operator=((interval *)&z_gps,&local_1168);
          if ((nmeadevice.bSaveRawData == 0) &&
             ((nmeadevice.threadperiod != 0 || (nmeadevice.bEnableGPGGA != 0)))) {
            memset(&tt,0,0x38);
            iVar2 = gettimeofday((timeval *)&timeptr,(__timezone_ptr_t)0x0);
            if (iVar2 != 0) {
              timeptr = (tm *)0x0;
              tv.tv_sec = 0;
            }
            tv.tv_usec = (__suseconds_t)timeptr;
            ptVar5 = gmtime(&tv.tv_usec);
            if (ptVar5 != (tm *)0x0) {
              t.tm_mday = ptVar5->tm_year;
              t.tm_hour = ptVar5->tm_mon;
              t.tm_min = ptVar5->tm_mday;
            }
            t.tm_sec = nmeadata.month;
            tt._4_4_ = nmeadata.day;
            tt._0_4_ = 0;
            t.tm_wday = 0;
            tv.tv_usec = timegm((tm *)&tt);
            utc = (double)tv.tv_usec * 1000.0 + (double)nmeadata._856_8_ * 1000.0;
          }
        }
        if (((nmeadevice.bSaveRawData != 0) && (nmeadata.height_geoid._0_1_ == 'A')) ||
           (nmeadevice.bEnableGPRMC != 0)) {
          sog = nmeadata.Altitude_AGL;
          local_11b0 = fmod_2PI((1.5707963267948966 - nmeadata.SOG) - angle_env);
          interval::interval(&local_11a8,&local_11b0);
          local_11d0 = -3.141592653589793;
          local_11d8 = 3.141592653589793;
          interval::interval(&local_11c8,&local_11d0,&local_11d8);
          operator+(&local_1190,&local_11a8,&local_11c8);
          interval::operator=((interval *)&cog_gps,&local_1190);
        }
        if ((nmeadevice.bSaveRawData != 0) && (nmeadata.height_geoid._0_1_ == 'A')) {
          memset(&tt,0,0x38);
          t.tm_mday = nmeadata.COG._0_4_ + -0x76c;
          t.tm_hour = nmeadata.COG._4_4_ + -1;
          t.tm_min = nmeadata.year;
          t.tm_sec = nmeadata.month;
          tt._4_4_ = nmeadata.day;
          tt._0_4_ = 0;
          t.tm_wday = 0;
          tv.tv_usec = timegm((tm *)&tt);
          utc = (double)tv.tv_usec * 1000.0 + (double)nmeadata._856_8_ * 1000.0;
        }
        if ((nmeadevice.bEnableGPGLL != 0) && (robid == 0x8000)) {
          local_1210 = fmod_2PI((1.5707963267948966 - nmeadata.Pitch) - angle_env);
          interval::interval(&local_1208,&local_1210);
          local_1230 = -psi_ahrs_acc;
          interval::interval(&local_1228,&local_1230,&psi_ahrs_acc);
          operator+(&local_11f0,&local_1208,&local_1228);
          interval::operator=((interval *)&psi_ahrs,&local_11f0);
        }
        if ((nmeadevice.bEnableGPVTG != 0) || (nmeadevice.bEnableHCHDG != 0)) {
          dVar6 = fmod_2PI(-nmeadata.WindSpeed + 3.141592653589793);
          vawind = nmeadata.ApparentWindDir;
          psiawind = dVar6;
          if (bDisableRollWindCorrectionSailboat == 0) {
            dVar6 = sin(dVar6);
            dVar7 = Center((interval *)&phi_ahrs);
            dVar7 = cos(dVar7);
            dVar8 = cos(psiawind);
            dVar6 = atan2(dVar6,dVar7 * dVar8);
            dVar7 = Center((interval *)&psi_ahrs);
            psitwind = fmod_2PI(dVar6 + dVar7);
            dVar6 = vawind;
            if ((0.0 < vawind) && (GPS_SOG_for_valid_COG <= sog)) {
              dVar9 = sin(psitwind);
              dVar7 = sog;
              dVar8 = Center((interval *)&cog_gps);
              dVar10 = sin(dVar8);
              dVar8 = vawind;
              dVar11 = cos(psitwind);
              dVar7 = atan2(dVar6 * dVar9 + dVar7 * dVar10,dVar8 * dVar11);
              dVar6 = sog;
              dVar8 = Center((interval *)&cog_gps);
              dVar8 = cos(dVar8);
              psitwind = fmod_2PI(dVar6 * dVar8 + dVar7);
            }
          }
          else {
            dVar7 = Center((interval *)&psi_ahrs);
            psitwind = fmod_2PI(dVar6 + dVar7);
          }
        }
        if ((nmeadevice.bEnableIIMWV != 0) || (nmeadevice.bEnableWIMWV != 0)) {
          psitwind = fmod_2PI(((1.5707963267948966 - nmeadata.RateOfTurn) + 3.141592653589793) -
                              angle_env);
          vtwind = nmeadata.WindDir;
        }
        LeaveCriticalSection(&StateVariablesCS);
      }
      else {
        printf("Connection to a NMEADevice lost.\n");
        GNSSqualityNMEADevice[iVar1] = 0;
        chrono_period._68_4_ = 0;
        DisconnectNMEADevice((NMEADEVICE *)&nmeadata.AIS_COG);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_dc8 = local_dc8 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_dc8)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_0016798d:
      StopChronoQuick((CHRONO *)&errcount);
      GNSSqualityNMEADevice[iVar1] = 0;
      if (nmeadevice.RS232Port._784_8_ != 0) {
        fclose((FILE *)nmeadevice.RS232Port._784_8_);
        nmeadevice.RS232Port.DevType = 0;
        nmeadevice.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectNMEADevice((NMEADEVICE *)&nmeadata.AIS_COG);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE NMEADeviceThread(void* pParam)
{
	NMEADEVICE nmeadevice;
	NMEADATA nmeadata;
	struct tm t;
	time_t tt = 0;
	struct timeval tv;
	struct tm* timeptr = NULL;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int deviceid = (int)(intptr_t)pParam;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	sprintf(szCfgFilePath, "NMEADevice%d.txt", deviceid);

	memset(&nmeadevice, 0, sizeof(NMEADEVICE));

	GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseNMEADevice[deviceid])
		{
			if (bConnected)
			{
				printf("NMEADevice paused.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartNMEADevice[deviceid])
		{
			if (bConnected)
			{
				printf("Restarting a NMEADevice.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}
			bRestartNMEADevice[deviceid] = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectNMEADevice(&nmeadevice, szCfgFilePath) == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = nmeadevice.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (nmeadevice.pfSaveFile != NULL)
				{
					fclose(nmeadevice.pfSaveFile); 
					nmeadevice.pfSaveFile = NULL;
				}
				if ((nmeadevice.bSaveRawData)&&(nmeadevice.pfSaveFile == NULL)) 
				{
					if (strlen(nmeadevice.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", nmeadevice.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "nmeadevice");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					nmeadevice.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (nmeadevice.pfSaveFile == NULL) 
					{
						printf("Unable to create NMEADevice data file.\n");
						break;
					}
				}
			}
			else 
			{
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataNMEADevice(&nmeadevice, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				//printf("GPS_quality_indicator : %d, status : %c\n", nmeadata.GPS_quality_indicator, nmeadata.status);

				if ((nmeadata.GPS_quality_indicator > 0)||(nmeadata.status == 'A'))
				{
					GNSSqualityNMEADevice[deviceid] = AUTONOMOUS_GNSS_FIX;

					// Old...

					double x_gps_mes = 0, y_gps_mes = 0, z_gps_mes = 0;
					GPS2EnvCoordSystem(lat_env, long_env, alt_env, angle_env, nmeadata.Latitude, nmeadata.Longitude, nmeadata.Altitude, &x_gps_mes, &y_gps_mes, &z_gps_mes);
					// Default accuracy...
					x_gps = interval(x_gps_mes-GPS_med_acc, x_gps_mes+GPS_med_acc);
					y_gps = interval(y_gps_mes-GPS_med_acc, y_gps_mes+GPS_med_acc);
					z_gps = interval(z_gps_mes-5*GPS_med_acc, z_gps_mes+5*GPS_med_acc);

					if ((!nmeadevice.bEnableGPRMC)&&(nmeadevice.bEnableGPGGA||nmeadevice.bEnableGPGLL))
					{
						// Try to extrapolate UTC as ms from the computer date since not all the time and date data are available in GGA or GLL...
						memset(&t, 0, sizeof(t));
						if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
						tt = tv.tv_sec;
						timeptr = gmtime(&tt);
						if (timeptr != NULL)
						{
							t.tm_year = timeptr->tm_year; t.tm_mon = timeptr->tm_mon; t.tm_mday = timeptr->tm_mday;
						}
						t.tm_hour = nmeadata.hour; t.tm_min = nmeadata.minute; t.tm_sec = 0; t.tm_isdst = 0;
						tt = timegm(&t);
						utc = tt*1000.0+nmeadata.second*1000.0;
					}
				}
				else
				{
					GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				}

				// Should check better if valid...
				if ((nmeadevice.bEnableGPRMC&&(nmeadata.status == 'A'))||nmeadevice.bEnableGPVTG)
				{
					sog = nmeadata.SOG;
					cog_gps = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
				}

				if (nmeadevice.bEnableGPRMC&&(nmeadata.status == 'A'))
				{
					// Get UTC as ms.
					memset(&t, 0, sizeof(t));
					t.tm_year = nmeadata.year-1900; t.tm_mon = nmeadata.month-1; t.tm_mday = nmeadata.day; 
					t.tm_hour = nmeadata.hour; t.tm_min = nmeadata.minute; t.tm_sec = 0; t.tm_isdst = 0;
					tt = timegm(&t);
					utc = tt*1000.0+nmeadata.second*1000.0;
				}

				if (nmeadevice.bEnableHCHDG)
				{
					if (robid == SAILBOAT2_ROBID) psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
				}

				if (nmeadevice.bEnableIIMWV||nmeadevice.bEnableWIMWV)
				{
					// Apparent wind (in robot coordinate system).
					psiawind = fmod_2PI(-nmeadata.ApparentWindDir+M_PI); 
					vawind = nmeadata.ApparentWindSpeed;
					// True wind must be computed from apparent wind.
					if (bDisableRollWindCorrectionSailboat)
						psitwind = fmod_2PI(psiawind+Center(psi_ahrs)); // Robot speed and roll not taken into account...
					else
					{
						psitwind = fmod_2PI(atan2(sin(psiawind),cos(Center(phi_ahrs))*cos(psiawind))+Center(psi_ahrs)); // Robot speed not taken into account, but with roll correction...
						if ((vawind > 0)&&(sog >= GPS_SOG_for_valid_COG))
						{
							psitwind = fmod_2PI(atan2(vawind*sin(psitwind)+sog*sin(Center(cog_gps)),vawind*cos(psitwind))+sog*cos(Center(cog_gps))); // With speed correction...
						}
					}
				}

				if (nmeadevice.bEnableWIMWD||nmeadevice.bEnableWIMDA)
				{
					// True wind.
					psitwind = fmod_2PI(M_PI/2.0-nmeadata.WindDir+M_PI-angle_env);
					vtwind = nmeadata.WindSpeed;
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a NMEADevice lost.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}		
		}

		//printf("NMEADeviceThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;

	if (nmeadevice.pfSaveFile != NULL)
	{
		fclose(nmeadevice.pfSaveFile); 
		nmeadevice.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectNMEADevice(&nmeadevice);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}